

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

size_t __thiscall
robin_hood::detail::
Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
::findIdx<std::__cxx11::string>
          (Table<true,80ul,std::__cxx11::string,std::unique_ptr<Rml::Context,Rml::Releaser<Rml::Context>>,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  pointer __s1;
  size_t __n;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  uint uVar8;
  size_t *psVar9;
  uint uVar10;
  
  sVar7 = hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
          ::operator()((hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
                        *)this,key);
  iVar1 = *(int *)(this + 0x28);
  uVar10 = ((uint)sVar7 & 0x1f) >> ((byte)this[0x2c] & 0x3f);
  uVar8 = iVar1 + uVar10;
  uVar2 = *(ulong *)(this + 0x18);
  sVar7 = sVar7 >> 5 & uVar2;
  lVar3 = *(long *)this;
  lVar4 = *(long *)(this + 8);
  __s1 = (key->_M_dataplus)._M_p;
  __n = key->_M_string_length;
  uVar6 = (uint)*(byte *)(lVar4 + sVar7);
  psVar9 = (size_t *)(lVar3 + 0x30 + sVar7 * 0x28);
  uVar10 = uVar10 + iVar1 * 2;
  do {
    if ((uVar8 == uVar6) && (__n == psVar9[-5])) {
      if (__n == 0) {
        return sVar7;
      }
      iVar5 = bcmp(__s1,(void *)psVar9[-6],__n);
      if (iVar5 == 0) {
        return sVar7;
      }
    }
    if ((uVar10 == *(byte *)(lVar4 + 1 + sVar7)) && (__n == *psVar9)) {
      if (__n == 0) {
        return sVar7 + 1;
      }
      iVar5 = bcmp(__s1,(void *)psVar9[-1],__n);
      if (iVar5 == 0) {
        return sVar7 + 1;
      }
    }
    uVar8 = uVar8 + iVar1 * 2;
    uVar6 = (uint)*(byte *)(lVar4 + 2 + sVar7);
    sVar7 = sVar7 + 2;
    psVar9 = psVar9 + 10;
    uVar10 = uVar10 + iVar1 * 2;
    if (uVar6 < uVar8) {
      if (uVar2 == 0) {
        sVar7 = 0;
      }
      else {
        sVar7 = (lVar4 - lVar3 >> 3) * -0x3333333333333333;
      }
      return sVar7;
    }
  } while( true );
}

Assistant:

size_t findIdx(Other const& key) const {
        size_t idx{};
        InfoType info{};
        keyToIdx(key, &idx, &info);

        do {
            // unrolling this twice gives a bit of a speedup. More unrolling did not help.
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
            if (info == mInfo[idx] &&
                ROBIN_HOOD_LIKELY(WKeyEqual::operator()(key, mKeyVals[idx].getFirst()))) {
                return idx;
            }
            next(&info, &idx);
        } while (info <= mInfo[idx]);

        // nothing found!
        return mMask == 0 ? 0
                          : static_cast<size_t>(std::distance(
                                mKeyVals, reinterpret_cast_no_cast_align_warning<Node*>(mInfo)));
    }